

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int push_additional_extensions(ptls_handshake_properties_t *properties,ptls_buffer_t *sendbuf)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  ptls_raw_extension_t *ppStack_28;
  uint16_t _v;
  ptls_raw_extension_t *ext;
  ptls_buffer_t *ppStack_18;
  int ret;
  ptls_buffer_t *sendbuf_local;
  ptls_handshake_properties_t *properties_local;
  
  if ((properties != (ptls_handshake_properties_t *)0x0) &&
     (properties->additional_extensions != (ptls_raw_extension_t *)0x0)) {
    ppStack_18 = sendbuf;
    sendbuf_local = (ptls_buffer_t *)properties;
    for (ppStack_28 = properties->additional_extensions; ppStack_28->type != 0xffff;
        ppStack_28 = ppStack_28 + 1) {
      capacity._6_2_ = ppStack_28->type;
      capacity._4_1_ = (undefined1)(capacity._6_2_ >> 8);
      capacity._5_1_ = (undefined1)capacity._6_2_;
      ext._4_4_ = ptls_buffer__do_pushv(ppStack_18,(void *)((long)&capacity + 4),2);
      if (ext._4_4_ != 0) {
        return ext._4_4_;
      }
      body_start = 2;
      ext._4_4_ = ptls_buffer__do_pushv(ppStack_18,"",2);
      if (ext._4_4_ != 0) {
        return ext._4_4_;
      }
      sVar1 = ppStack_18->off;
      iVar3 = ptls_buffer__do_pushv(ppStack_18,(ppStack_28->data).base,(ppStack_28->data).len);
      if (iVar3 != 0) {
        return iVar3;
      }
      sVar2 = ppStack_18->off;
      for (; body_start != 0; body_start = body_start - 1) {
        ppStack_18->base[sVar1 - body_start] =
             (uint8_t)(sVar2 - sVar1 >> (((char)body_start + -1) * '\b' & 0x3fU));
      }
      ext._4_4_ = 0;
    }
  }
  return 0;
}

Assistant:

static int push_additional_extensions(ptls_handshake_properties_t *properties, ptls_buffer_t *sendbuf)
{
    int ret;

    if (properties != NULL && properties->additional_extensions != NULL) {
        ptls_raw_extension_t *ext;
        for (ext = properties->additional_extensions; ext->type != UINT16_MAX; ++ext) {
            buffer_push_extension(sendbuf, ext->type, { ptls_buffer_pushv(sendbuf, ext->data.base, ext->data.len); });
        }
    }
    ret = 0;
Exit:
    return ret;
}